

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectBase.hpp
# Opt level: O2

Int32 __thiscall
Diligent::DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
::GetUniqueID(DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
              *this)

{
  int iVar1;
  string msg;
  string local_30;
  
  iVar1 = this->m_UniqueID;
  if (iVar1 == 0) {
    FormatString<char[103]>
              (&local_30,
               (char (*) [103])
               "Unique ID is not initialized. This indicates that this device object has been created without a device"
              );
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetUniqueID",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
               ,0xa1);
    std::__cxx11::string::~string((string *)&local_30);
    iVar1 = this->m_UniqueID;
  }
  return iVar1;
}

Assistant:

GetUniqueID() const override final
    {
        VERIFY(m_UniqueID != 0, "Unique ID is not initialized. This indicates that this device object has been created without a device");
        return m_UniqueID;
    }